

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsCore.c
# Opt level: O1

int Abc_NtkMfsNode(Mfs_Man_t *p,Abc_Obj_t *pNode)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  Aig_Man_t *pAVar4;
  Cnf_Dat_t *pCVar5;
  sat_solver *psVar6;
  Hop_Obj_t *pObj;
  long lVar7;
  long lVar8;
  float dProb;
  timespec ts;
  timespec local_38;
  
  p->nNodesTried = p->nNodesTried + 1;
  Mfs_ManClean(p);
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar7 = 1;
  }
  else {
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
    lVar7 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_38.tv_sec * -1000000;
  }
  pVVar3 = Abc_MfsComputeRoots(pNode,p->pPars->nWinTfoLevs,p->pPars->nFanoutsMax);
  p->vRoots = pVVar3;
  pVVar3 = Abc_NtkNodeSupport(p->pNtk,(Abc_Obj_t **)pVVar3->pArray,pVVar3->nSize);
  p->vSupp = pVVar3;
  pVVar3 = Abc_NtkDfsNodes(p->pNtk,(Abc_Obj_t **)p->vRoots->pArray,p->vRoots->nSize);
  p->vNodes = pVVar3;
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar8 = -1;
  }
  else {
    lVar8 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
  }
  p->timeWin = p->timeWin + lVar8 + lVar7;
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar7 = 1;
  }
  else {
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
    lVar7 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_38.tv_sec * -1000000;
  }
  pAVar4 = Abc_NtkConstructAig(p,pNode);
  p->pAigWin = pAVar4;
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar8 = -1;
  }
  else {
    lVar8 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
  }
  p->timeAig = p->timeAig + lVar8 + lVar7;
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar7 = 1;
  }
  else {
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
    lVar7 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_38.tv_sec * -1000000;
  }
  pCVar5 = Cnf_DeriveSimple(p->pAigWin,(pNode->vFanins).nSize);
  p->pCnf = pCVar5;
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar8 = -1;
  }
  else {
    lVar8 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
  }
  p->timeCnf = p->timeCnf + lVar8 + lVar7;
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar7 = 1;
  }
  else {
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
    lVar7 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_38.tv_sec * -1000000;
  }
  psVar6 = (sat_solver *)Cnf_DataWriteIntoSolver(p->pCnf,1,0);
  p->pSat = psVar6;
  if ((psVar6 != (sat_solver *)0x0) && (p->pPars->fOneHotness != 0)) {
    Abc_NtkAddOneHotness(p);
  }
  iVar1 = 0;
  if (p->pSat != (sat_solver *)0x0) {
    iVar1 = Abc_NtkMfsSolveSat(p,pNode);
    p->nTotConfLevel = p->nTotConfLevel + (int)(p->pSat->stats).conflicts;
    iVar2 = clock_gettime(3,&local_38);
    if (iVar2 < 0) {
      lVar8 = -1;
    }
    else {
      lVar8 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
    }
    p->timeSat = p->timeSat + lVar8 + lVar7;
    if (iVar1 == 0) {
      p->nTimeOutsLevel = p->nTimeOutsLevel + 1;
      p->nTimeOuts = p->nTimeOuts + 1;
      iVar1 = 0;
    }
    else {
      if (p->nFanins != (pNode->vFanins).nSize) {
        __assert_fail("p->nFanins == Abc_ObjFaninNum(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/mfs/mfsCore.c"
                      ,0x160,"int Abc_NtkMfsNode(Mfs_Man_t *, Abc_Obj_t *)");
      }
      if (p->pPars->fPower == 0) {
        dProb = -1.0;
      }
      else {
        dProb = (float)p->vProbs->pArray[pNode->Id];
      }
      pObj = Abc_NodeIfNodeResyn(p->pManDec,(Hop_Man_t *)pNode->pNtk->pManFunc,
                                 (Hop_Obj_t *)(pNode->field_5).pData,p->nFanins,p->vTruth,p->uCare,
                                 dProb);
      iVar2 = Hop_DagSize((Hop_Obj_t *)(pNode->field_5).pData);
      iVar1 = Hop_DagSize(pObj);
      iVar2 = iVar2 - iVar1;
      iVar1 = 1;
      if (-1 < iVar2) {
        p->nNodesDec = p->nNodesDec + 1;
        p->nNodesGained = p->nNodesGained + iVar2;
        p->nNodesGainedLevel = p->nNodesGainedLevel + iVar2;
        (pNode->field_5).pData = pObj;
      }
    }
  }
  return iVar1;
}

Assistant:

int Abc_NtkMfsNode( Mfs_Man_t * p, Abc_Obj_t * pNode )
{
    Hop_Obj_t * pObj;
    int RetValue;
    float dProb;
    extern Hop_Obj_t * Abc_NodeIfNodeResyn( Bdc_Man_t * p, Hop_Man_t * pHop, Hop_Obj_t * pRoot, int nVars, Vec_Int_t * vTruth, unsigned * puCare, float dProb );

    int nGain;
    abctime clk;
    p->nNodesTried++;
    // prepare data structure for this node
    Mfs_ManClean( p );
    // compute window roots, window support, and window nodes
clk = Abc_Clock();
    p->vRoots = Abc_MfsComputeRoots( pNode, p->pPars->nWinTfoLevs, p->pPars->nFanoutsMax );
    p->vSupp  = Abc_NtkNodeSupport( p->pNtk, (Abc_Obj_t **)Vec_PtrArray(p->vRoots), Vec_PtrSize(p->vRoots) );
    p->vNodes = Abc_NtkDfsNodes( p->pNtk, (Abc_Obj_t **)Vec_PtrArray(p->vRoots), Vec_PtrSize(p->vRoots) );
p->timeWin += Abc_Clock() - clk;
    // count the number of patterns
//    p->dTotalRatios += Abc_NtkConstraintRatio( p, pNode );
    // construct AIG for the window
clk = Abc_Clock();
    p->pAigWin = Abc_NtkConstructAig( p, pNode );
p->timeAig += Abc_Clock() - clk;
    // translate it into CNF
clk = Abc_Clock();
    p->pCnf = Cnf_DeriveSimple( p->pAigWin, Abc_ObjFaninNum(pNode) );
p->timeCnf += Abc_Clock() - clk;
    // create the SAT problem
clk = Abc_Clock();
    p->pSat = (sat_solver *)Cnf_DataWriteIntoSolver( p->pCnf, 1, 0 );
    if ( p->pSat && p->pPars->fOneHotness )
        Abc_NtkAddOneHotness( p );
    if ( p->pSat == NULL )
        return 0;
    // solve the SAT problem
    RetValue = Abc_NtkMfsSolveSat( p, pNode );
    p->nTotConfLevel += p->pSat->stats.conflicts;
p->timeSat += Abc_Clock() - clk;
    if ( RetValue == 0 )
    {
        p->nTimeOutsLevel++;
        p->nTimeOuts++;
        return 0;
    }
    // minimize the local function of the node using bi-decomposition
    assert( p->nFanins == Abc_ObjFaninNum(pNode) );
    dProb = p->pPars->fPower? ((float *)p->vProbs->pArray)[pNode->Id] : -1.0;
    pObj = Abc_NodeIfNodeResyn( p->pManDec, (Hop_Man_t *)pNode->pNtk->pManFunc, (Hop_Obj_t *)pNode->pData, p->nFanins, p->vTruth, p->uCare, dProb );
    nGain = Hop_DagSize((Hop_Obj_t *)pNode->pData) - Hop_DagSize(pObj);
    if ( nGain >= 0 )
    {
        p->nNodesDec++;
        p->nNodesGained += nGain;
        p->nNodesGainedLevel += nGain;
        pNode->pData = pObj;
    }
    return 1;
}